

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O2

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<int,void,void>(ostream_base *this,int v)

{
  ostream_base *poVar1;
  size_t in_RCX;
  void *in_RDX;
  
  if (v < 0) {
    write(this,0x2d,in_RDX,in_RCX);
    v = -v;
  }
  poVar1 = write<unsigned_int,void>(this,v);
  return poVar1;
}

Assistant:

ostream_base & write (Signed const v) {
                    using unsigned_type = typename std::make_unsigned<Signed>::type;
                    if (v < 0) {
                        this->write ('-');
                        if (v == std::numeric_limits<Signed>::min ()) {
                            return this->write (static_cast<unsigned_type> (v));
                        }
                        return this->write (static_cast<unsigned_type> (-v));
                    }
                    return this->write (static_cast<unsigned_type> (v));
                }